

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.h
# Opt level: O1

void __thiscall Threadpool<Searchthread>::Threadpool(Threadpool<Searchthread> *this)

{
  (this->tasks).super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->tasks).super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->tasks).super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->tasks).super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->tasks).super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->tasks).super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->tasks).super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->tasks).super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->workers).super__Vector_base<Searchthread_*,_std::allocator<Searchthread_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->tasks).super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->workers).super__Vector_base<Searchthread_*,_std::allocator<Searchthread_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->workers).super__Vector_base<Searchthread_*,_std::allocator<Searchthread_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tasks).super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
  _M_initialize_map(&(this->tasks).
                     super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                    ,0);
  *(undefined8 *)((long)&(this->m).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->m).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m).super___mutex_base._M_mutex + 8) = 0;
  (this->m).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&this->cv_task);
  std::condition_variable::condition_variable(&this->cv_finished);
  this->busy = (__atomic_base<unsigned_int>)0x0;
  this->processed = (__atomic_base<unsigned_int>)0x0;
  (this->stop)._M_base._M_i = false;
  return;
}

Assistant:

Threadpool() { }